

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::GetArgInstrsForCallAndApply
          (Inline *this,Instr *callInstr,Instr **implicitThisArgOut,Instr **explicitThisArgOut,
          Instr **argumentsOrArrayArgOut,uint *argOutCount)

{
  byte *pbVar1;
  Opnd *this_00;
  _func_int **pp_Var2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  uint uVar9;
  Instr *pIVar10;
  Instr *pIVar11;
  Instr *this_01;
  Opnd *local_38;
  
  local_38 = callInstr->m_src2;
  OVar4 = IR::Opnd::GetKind(local_38);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar5) goto LAB_005518da;
    *puVar7 = 0;
  }
  pSVar8 = IR::Opnd::GetStackSym(callInstr->m_src2);
  this_01 = (pSVar8->field_5).m_instrDef;
  pIVar11 = callInstr;
  if ((this_01 != (Instr *)0x0 & pSVar8->field_0x18) == 1) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_005518da;
    *puVar7 = 0;
    this_01 = (pSVar8->field_5).m_instrDef;
  }
  do {
    if ((this_01->m_src2 == (Opnd *)0x0) ||
       (OVar4 = IR::Opnd::GetKind(this_01->m_src2), OVar4 != OpndKindSym)) {
LAB_00551664:
      pIVar10 = (Instr *)0x0;
    }
    else {
      this_00 = this_01->m_src2;
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      pp_Var2 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      uVar6 = *(uint *)(pp_Var2 + 3);
      uVar9 = uVar6 & 0x100000;
      if ((uVar9 != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
        uVar9 = uVar6 & 0x100000;
      }
      if (uVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
      }
      if (((((uVar6 & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_00551664;
      pIVar10 = (Instr *)pp_Var2[5];
    }
    if (this_01->m_opcode != ArgOut_A_InlineSpecialized) {
      if (this_01->m_opcode == StartCall) {
        if (pIVar10 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_005518da;
          *puVar7 = 0;
        }
        break;
      }
      *argOutCount = *argOutCount + 1;
      *argumentsOrArrayArgOut = *explicitThisArgOut;
      *explicitThisArgOut = *implicitThisArgOut;
      *implicitThisArgOut = this_01;
      OVar4 = IR::Opnd::GetKind(local_38);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      pp_Var2 = local_38[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      pbVar1 = (byte *)((long)pp_Var2 + 0x19);
      *pbVar1 = *pbVar1 | 0x40;
      OVar4 = IR::Opnd::GetKind(local_38);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      pp_Var2 = local_38[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_005518da;
        *puVar7 = 0;
      }
      pbVar1 = (byte *)((long)pp_Var2 + 0x19);
      *pbVar1 = *pbVar1 | 0x10;
      this_01->m_opcode = ArgOut_A_InlineBuiltIn;
      IR::Instr::GenerateBytecodeArgOutCapture(this_01);
      IR::Instr::Move(this_01,pIVar11);
      local_38 = this_01->m_src2;
      pIVar11 = this_01;
    }
    this_01 = pIVar10;
  } while (pIVar10 != (Instr *)0x0);
  OVar4 = IR::Opnd::GetKind(local_38);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) {
LAB_005518da:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  *(uint *)(local_38[1]._vptr_Opnd + 3) = *(uint *)(local_38[1]._vptr_Opnd + 3) | 0x4000;
  return;
}

Assistant:

void Inline::GetArgInstrsForCallAndApply(IR::Instr* callInstr, IR::Instr** implicitThisArgOut, IR::Instr** explicitThisArgOut, IR::Instr** argumentsOrArrayArgOut, uint &argOutCount)
{
    IR::Opnd * linkOpnd = callInstr->GetSrc2()->AsSymOpnd();
    IR::Instr * argInsertInstr = callInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argOutCount++;

        *argumentsOrArrayArgOut = *explicitThisArgOut;
        *explicitThisArgOut = *implicitThisArgOut;
        *implicitThisArgOut = argInstr;

        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_isInlinedArgSlot = true;
        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_allocated = true;
        ConvertToInlineBuiltInArgOut(argInstr);

        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;

        linkOpnd = argInstr->GetSrc2();
        return false;
    });
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;
}